

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

void roaring64_bitmap_remove_bulk
               (roaring64_bitmap_t *r,roaring64_bulk_context_t *context,uint64_t val)

{
  uint8_t type;
  roaring64_leaf_t *prVar1;
  int iVar2;
  leaf_t *plVar3;
  int *c;
  int *piVar4;
  art_val_t *__ptr;
  long lVar5;
  uint8_t uVar6;
  uint8_t typecode2;
  uint8_t high48 [6];
  uint8_t local_31;
  uint local_30;
  ushort local_2c;
  
  local_30 = (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
             (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  local_2c = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  if ((context->leaf == (roaring64_leaf_t *)0x0) ||
     (iVar2 = art_compare_keys(context->high_bytes,(art_key_chunk_t *)&local_30), iVar2 != 0)) {
    plVar3 = (leaf_t *)art_find(&r->art,(art_key_chunk_t *)&local_30);
    plVar3 = containerptr_roaring64_bitmap_remove(r,(uint8_t *)&local_30,(uint16_t)val,plVar3);
    context->leaf = plVar3;
    *(uint *)context->high_bytes = local_30;
    *(ushort *)(context->high_bytes + 4) = local_2c;
  }
  else {
    c = (int *)container_remove(context->leaf->container,(uint16_t)val,context->leaf->typecode,
                                &local_31);
    piVar4 = (int *)context->leaf->container;
    type = local_31;
    if (c != piVar4) {
      container_free(piVar4,context->leaf->typecode);
      prVar1 = context->leaf;
      prVar1->container = c;
      prVar1->typecode = local_31;
      type = local_31;
    }
    piVar4 = c;
    uVar6 = type;
    if (type == '\x04') {
      uVar6 = (uint8_t)c[2];
      piVar4 = *(int **)c;
    }
    iVar2 = *piVar4;
    if ((uVar6 == '\x03') || (uVar6 == '\x02')) {
      if (0 < iVar2) {
        return;
      }
    }
    else if (iVar2 != 0) {
      if (iVar2 != -1) {
        return;
      }
      lVar5 = 0;
      do {
        if (*(long *)(*(long *)(piVar4 + 2) + lVar5 * 8) != 0) {
          return;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x400);
    }
    __ptr = art_erase(&r->art,(art_key_chunk_t *)&local_30);
    container_free(c,type);
    roaring_free(__ptr);
  }
  return;
}

Assistant:

void roaring64_bitmap_remove_bulk(roaring64_bitmap_t *r,
                                  roaring64_bulk_context_t *context,
                                  uint64_t val) {
    art_t *art = &r->art;
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    if (context->leaf != NULL &&
        compare_high48(context->high_bytes, high48) == 0) {
        // We're at a container with the correct high bits.
        uint8_t typecode2;
        container_t *container2 =
            container_remove(context->leaf->container, low16,
                             context->leaf->typecode, &typecode2);
        if (container2 != context->leaf->container) {
            container_free(context->leaf->container, context->leaf->typecode);
            context->leaf->container = container2;
            context->leaf->typecode = typecode2;
        }
        if (!container_nonzero_cardinality(container2, typecode2)) {
            leaf_t *leaf = (leaf_t *)art_erase(art, high48);
            container_free(container2, typecode2);
            free_leaf(leaf);
        }
    } else {
        // We're not positioned anywhere yet or the high bits of the key
        // differ.
        leaf_t *leaf = (leaf_t *)art_find(art, high48);
        context->leaf =
            containerptr_roaring64_bitmap_remove(r, high48, low16, leaf);
        memcpy(context->high_bytes, high48, ART_KEY_BYTES);
    }
}